

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O3

void __thiscall UnitTest_parser_exp2::UnitTest_parser_exp2(UnitTest_parser_exp2 *this)

{
  UnitTestBase::UnitTestBase(&this->super_UnitTestBase);
  (this->super_UnitTestBase)._vptr_UnitTestBase = (_func_int **)&PTR_Run_001859e8;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_UnitTestBase).test_name_,0,
             (char *)(this->super_UnitTestBase).test_name_._M_string_length,0x165b6d);
  return;
}

Assistant:

TEST_CASE(parser_exp2)
{
    auto root = Parse("a = 1 + 2 + 3 * 4");
    auto exp_list = ASTFind<luna::ExpressionList>(root, AcceptAST());
    EXPECT_TRUE(exp_list->exp_list_.size() == 1);
    auto &exp = exp_list->exp_list_[0];
    auto bin_exp = dynamic_cast<luna::BinaryExpression *>(exp.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');

    // 1 + 2
    auto left = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(left);
    EXPECT_TRUE(left->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->right_.get()));

    // 3 * 4
    auto right = dynamic_cast<luna::BinaryExpression *>(bin_exp->right_.get());
    EXPECT_TRUE(right);
    EXPECT_TRUE(right->op_token_.token_ == '*');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->right_.get()));
}